

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,RsRuleSyntax *syntax)

{
  Compilation *args;
  size_t sVar1;
  pointer ppRVar2;
  RsCodeBlockSyntax *pRVar3;
  SyntaxNode *syntax_00;
  StatementBlockSymbol *pSVar4;
  StatementBlockSymbol *pSVar5;
  long lVar6;
  Scope *this;
  VariableLifetime local_60;
  StatementBlockKind local_5c;
  SourceLocation local_58;
  Token local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  args = scope->compilation;
  local_40._M_len = 0;
  local_40._M_str = "";
  local_50 = slang::syntax::SyntaxNode::getFirstToken(&syntax->super_SyntaxNode);
  local_58 = parsing::Token::location(&local_50);
  local_5c = Sequential;
  local_60 = Automatic;
  pSVar4 = BumpAllocator::
           emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                     (&args->super_BumpAllocator,args,&local_40,&local_58,&local_5c,&local_60);
  (pSVar4->super_Symbol).originatingSyntax = &syntax->super_SyntaxNode;
  this = &pSVar4->super_Scope;
  Scope::getOrAddDeferredData(this);
  sVar1 = (syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppRVar2 = (syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar6 = 0;
    do {
      pRVar3 = *(RsCodeBlockSyntax **)((long)ppRVar2 + lVar6);
      syntax_00 = (pRVar3->super_RsProdSyntax).super_SyntaxNode.previewNode;
      if (syntax_00 != (SyntaxNode *)0x0) {
        Scope::addMembers(this,syntax_00);
      }
      if ((pRVar3->super_RsProdSyntax).super_SyntaxNode.kind == RsCodeBlock) {
        pSVar5 = fromSyntax(scope,pRVar3);
        Scope::insertMember(this,&pSVar5->super_Symbol,(pSVar4->super_Scope).lastMember,false,true);
      }
      if ((syntax->weightClause != (RsWeightClauseSyntax *)0x0) &&
         (pRVar3 = (RsCodeBlockSyntax *)syntax->weightClause->codeBlock,
         pRVar3 != (RsCodeBlockSyntax *)0x0)) {
        pSVar5 = fromSyntax(scope,pRVar3);
        Scope::insertMember(this,&pSVar5->super_Symbol,(pSVar4->super_Scope).lastMember,false,true);
      }
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  return pSVar4;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const RsRuleSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<StatementBlockSymbol>(comp, ""sv, syntax.getFirstToken().location(),
                                                     StatementBlockKind::Sequential,
                                                     VariableLifetime::Automatic);
    result->setSyntax(syntax);
    result->setNeedElaboration();

    for (auto prod : syntax.prods) {
        if (prod->previewNode)
            result->addMembers(*prod->previewNode);

        if (prod->kind == SyntaxKind::RsCodeBlock) {
            result->addMember(
                StatementBlockSymbol::fromSyntax(scope, prod->as<RsCodeBlockSyntax>()));
        }

        if (syntax.weightClause && syntax.weightClause->codeBlock) {
            result->addMember(StatementBlockSymbol::fromSyntax(
                scope, syntax.weightClause->codeBlock->as<RsCodeBlockSyntax>()));
        }
    }

    return *result;
}